

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecChoice.c
# Opt level: O0

Gia_Man_t * Cec_ManChoiceComputation(Gia_Man_t *pAig,Cec_ParChc_t *pParsChc)

{
  Aig_Man_t *pAVar1;
  Gia_Man_t *pGVar2;
  Gia_Man_t *pGia;
  Aig_Man_t *pManNew;
  Aig_Man_t *pMan;
  Dch_Pars_t *pPars;
  Dch_Pars_t Pars;
  Cec_ParChc_t *pParsChc_local;
  Gia_Man_t *pAig_local;
  
  Pars._56_8_ = pParsChc;
  pAVar1 = Gia_ManToAig(pAig,0);
  Dch_ManSetDefaultParams((Dch_Pars_t *)&pPars);
  Pars.fSimulateTfo = 1;
  pPars._4_4_ = *(undefined4 *)(Pars._56_8_ + 8);
  Pars.fPower = *(int *)(Pars._56_8_ + 0x10);
  Pars.fLightSynth = *(int *)(Pars._56_8_ + 0x18);
  pAVar1 = Dar_ManChoiceNew(pAVar1,(Dch_Pars_t *)&pPars);
  pGVar2 = Gia_ManFromAig(pAVar1);
  Aig_ManStop(pAVar1);
  return pGVar2;
}

Assistant:

Gia_Man_t * Cec_ManChoiceComputation( Gia_Man_t * pAig, Cec_ParChc_t * pParsChc )
{
//    extern Aig_Man_t * Dar_ManChoiceNew( Aig_Man_t * pAig, Dch_Pars_t * pPars );
    Dch_Pars_t Pars, * pPars = &Pars;
    Aig_Man_t * pMan, * pManNew;
    Gia_Man_t * pGia;
    if ( 0 ) 
    {
        pGia = Cec_ManChoiceComputationVec( pAig, 3, pParsChc );
    }
    else
    {
        pMan = Gia_ManToAig( pAig, 0 );
        Dch_ManSetDefaultParams( pPars );
        pPars->fUseGia  = 1;
        pPars->nBTLimit = pParsChc->nBTLimit;
        pPars->fUseCSat = pParsChc->fUseCSat;
        pPars->fVerbose = pParsChc->fVerbose;
        pManNew = Dar_ManChoiceNew( pMan, pPars );
        pGia = Gia_ManFromAig( pManNew );
        Aig_ManStop( pManNew );
//        Aig_ManStop( pMan );
    }
    return pGia;
}